

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O2

void re2c::printSpan(ostream *o,uint32_t lb,uint32_t ub)

{
  std::operator<<(o,"[");
  prtChOrHexForSpan(o,lb);
  if (ub - lb != 1) {
    std::operator<<(o,"-");
    prtChOrHexForSpan(o,ub - 1);
  }
  std::operator<<(o,"]");
  return;
}

Assistant:

void printSpan(std::ostream& o, uint32_t lb, uint32_t ub)
{
	o << "[";
	if ((ub - lb) == 1)
	{
		prtChOrHexForSpan(o, lb);
	}
	else
	{
		prtChOrHexForSpan(o, lb);
		o << "-";
		prtChOrHexForSpan(o, ub - 1);
	}
	o << "]";
}